

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CoshLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cosh(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2f3) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2f3;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    CoshLayerParams::CoshLayerParams(this_00.cosh_);
    (this->layer_).cosh_ = (CoshLayerParams *)this_00;
  }
  return (CoshLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CoshLayerParams* NeuralNetworkLayer::mutable_cosh() {
  if (!has_cosh()) {
    clear_layer();
    set_has_cosh();
    layer_.cosh_ = new ::CoreML::Specification::CoshLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cosh)
  return layer_.cosh_;
}